

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_tiff_16_file(ConstPtr *image,string *filename)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  pointer puVar4;
  long lVar5;
  FileException *this;
  Exception *this_00;
  long lVar6;
  code *pcVar7;
  pointer_____offset_0x10___ *ppuVar8;
  pointer puVar9;
  string local_58;
  allocator local_31;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr == (element_type *)0x0) {
    this = (FileException *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this,"Null image given");
    ppuVar8 = (pointer_____offset_0x10___ *)&std::invalid_argument::typeinfo;
    pcVar7 = std::invalid_argument::~invalid_argument;
  }
  else {
    lVar5 = TIFFOpen((filename->_M_dataplus)._M_p,"w");
    if (lVar5 != 0) {
      peVar3 = (image->
               super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar1 = (peVar3->super_TypedImageBase<unsigned_short>).super_ImageBase.h;
      iVar2 = (peVar3->super_TypedImageBase<unsigned_short>).super_ImageBase.c;
      TIFFSetField(lVar5,0x100,(peVar3->super_TypedImageBase<unsigned_short>).super_ImageBase.w);
      TIFFSetField(lVar5,0x101,iVar1);
      TIFFSetField(lVar5,0x115,iVar2);
      TIFFSetField(lVar5,0x102,0x10);
      TIFFSetField(lVar5,0x103,0x80b2);
      TIFFSetField(lVar5,0x11c,1);
      TIFFSetField(lVar5,0x106,2);
      peVar3 = (image->
               super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      puVar4 = (peVar3->super_TypedImageBase<unsigned_short>).data.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = (long)*(pointer *)
                     ((long)&(peVar3->super_TypedImageBase<unsigned_short>).data.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data + 8) - (long)puVar4;
      puVar9 = (pointer)0x0;
      if (lVar6 != 0) {
        puVar9 = puVar4;
      }
      lVar6 = TIFFWriteEncodedStrip(lVar5,0,puVar9,lVar6 * 0x80000000 >> 0x1f & 0xfffffffffffffffe);
      TIFFClose(lVar5);
      if (-1 < lVar6) {
        return;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_58,"Error writing TIFF image",&local_31);
      util::Exception::Exception(this_00,&local_58);
      __cxa_throw(this_00,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    this = (FileException *)__cxa_allocate_exception(0x48);
    util::FileException::FileException(this,filename,"Unknown TIFF file error");
    ppuVar8 = &util::FileException::typeinfo;
    pcVar7 = util::FileException::~FileException;
  }
  __cxa_throw(this,ppuVar8,pcVar7);
}

Assistant:

void
save_tiff_16_file (RawImage::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    TIFF* tif = TIFFOpen(filename.c_str(), "w");
    if (!tif)
        throw util::FileException(filename, "Unknown TIFF file error");

    uint32_t width = image->width();
    uint32_t height = image->height();
    uint32_t channels = image->channels();
    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, channels);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 8 * sizeof(uint16_t));
    TIFFSetField(tif, TIFFTAG_COMPRESSION, COMPRESSION_DEFLATE);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, PHOTOMETRIC_RGB);

    tdata_t buffer = const_cast<uint16_t*>(image->get_data_pointer());
    int64_t ret = TIFFWriteEncodedStrip(tif, 0, buffer,
        image->get_value_amount() * sizeof(uint16_t));

    TIFFClose(tif);

    if (ret < 0)
        throw util::Exception("Error writing TIFF image");
}